

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_rtree_geometry_callback
              (sqlite3 *db,char *zGeom,
              _func_int_sqlite3_rtree_geometry_ptr_int_RtreeDValue_ptr_int_ptr *xGeom,void *pContext
              )

{
  undefined8 *puVar1;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_RCX;
  void *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_stack_00000010;
  RtreeGeomCallback *pGeomCtx;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  puVar1 = (undefined8 *)sqlite3_malloc((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  if (puVar1 == (undefined8 *)0x0) {
    iVar2 = 7;
  }
  else {
    *puVar1 = in_RDX;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = in_RCX;
    iVar2 = sqlite3_create_function_v2
                      ((sqlite3 *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_RDX,in_RCX,
                       in_stack_00000010,(_func_void_sqlite3_context_ptr *)pGeomCtx,
                       (_func_void_void_ptr *)pContext);
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_rtree_geometry_callback(
  sqlite3 *db,                  /* Register SQL function on this connection */
  const char *zGeom,            /* Name of the new SQL function */
  int (*xGeom)(sqlite3_rtree_geometry*,int,RtreeDValue*,int*), /* Callback */
  void *pContext                /* Extra data associated with the callback */
){
  RtreeGeomCallback *pGeomCtx;      /* Context object for new user-function */

  /* Allocate and populate the context object. */
  pGeomCtx = (RtreeGeomCallback *)sqlite3_malloc(sizeof(RtreeGeomCallback));
  if( !pGeomCtx ) return SQLITE_NOMEM;
  pGeomCtx->xGeom = xGeom;
  pGeomCtx->xQueryFunc = 0;
  pGeomCtx->xDestructor = 0;
  pGeomCtx->pContext = pContext;
  return sqlite3_create_function_v2(db, zGeom, -1, SQLITE_ANY,
      (void *)pGeomCtx, geomCallback, 0, 0, rtreeFreeCallback
  );
}